

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall vm::VM::loada(VM *this,u2 level_diff,addr_t offset)

{
  pointer pCVar1;
  addr_t aVar2;
  int iVar3;
  ulong uVar4;
  undefined6 in_register_00000032;
  int iVar5;
  char *this_00;
  
  pCVar1 = (this->_contexts).super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->_contexts).
                super__Vector_base<vm::VM::Context,_std::allocator<vm::VM::Context>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pCVar1 >> 6;
  iVar3 = (int)uVar4 + -1;
  if ((int)CONCAT62(in_register_00000032,level_diff) != 0) {
    iVar5 = level_diff + 1;
    do {
      if (uVar4 <= (ulong)(long)iVar3) goto LAB_00118da4;
      iVar3 = pCVar1[iVar3].staticLink;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  if ((ulong)(long)iVar3 < uVar4) {
    iVar3 = pCVar1[iVar3].BP;
    ensureStackRest(this,1);
    iVar5 = this->_sp;
    this->_sp = iVar5 + 1;
    (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl[iVar5] = offset + iVar3;
    return;
  }
LAB_00118da4:
  this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  ensureStackUsed((VM *)this_00,1);
  iVar3 = ((VM *)this_00)->_sp;
  ((VM *)this_00)->_sp = iVar3 + -1;
  aVar2 = NEW((VM *)this_00,
              (((VM *)this_00)->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
              ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar3 + -1]);
  ensureStackRest((VM *)this_00,1);
  iVar3 = ((VM *)this_00)->_sp;
  ((VM *)this_00)->_sp = iVar3 + 1;
  (((VM *)this_00)->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl[iVar3] = aVar2;
  return;
}

Assistant:

void VM::loada(u2 level_diff, addr_t offset) {
    int staticLink = _contexts.size()-1;
    for (int ld = level_diff; ld > 0; --ld) {
        staticLink = _contexts.at(staticLink).staticLink;
    }
    addr_t bp = _contexts.at(staticLink).BP;
    PUSH<addr_t>(bp+offset);
}